

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

qreal __thiscall QGraphicsItemAnimation::verticalScaleAt(QGraphicsItemAnimation *this,qreal step)

{
  char *this_00;
  qreal qVar1;
  
  this_00 = "verticalScaleAt";
  check_step_valid(step,"verticalScaleAt");
  qVar1 = QGraphicsItemAnimationPrivate::linearValueForStep
                    ((QGraphicsItemAnimationPrivate *)this_00,step,
                     (QList<QGraphicsItemAnimationPrivate::Pair> *)(*(long *)(this + 0x10) + 0xd0),
                     1.0);
  return qVar1;
}

Assistant:

qreal QGraphicsItemAnimation::verticalScaleAt(qreal step) const
{
    check_step_valid(step, "verticalScaleAt");

    return d->linearValueForStep(step, d->verticalScale, 1);
}